

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  const_reference this_00;
  const_reference pvVar8;
  reference this_01;
  float *pfVar9;
  int *piVar10;
  ulong uVar11;
  void *pvVar12;
  Mat *src_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  Mat dst_1;
  Mat src_1;
  int q_3;
  float *beta_1;
  float *alpha_3;
  int *yofs_1;
  int *xofs_3;
  int *buf_3;
  Mat dst;
  Mat src;
  int q_2;
  float *beta;
  float *alpha_2;
  int *yofs;
  int *xofs_2;
  int *buf_2;
  int in_x_1;
  int x_3;
  int in_y;
  int y_3;
  float *outptr_3;
  float *ptr_3;
  int q_1;
  float ws_1;
  float hs;
  float a3;
  float a2;
  float a1_1;
  float a0_1;
  float *Sp_1;
  int sx_1;
  int x_2;
  float *alphap_1;
  float *outptr_2;
  float *ptr_2;
  int y_2;
  float *alpha_1;
  int *xofs_1;
  int *buf_1;
  float a1;
  float a0;
  float *Sp;
  int sx;
  int x_1;
  float *alphap;
  float *outptr_1;
  float *ptr_1;
  int y_1;
  float *alpha;
  int *xofs;
  int *buf;
  int in_x;
  int x;
  float *outptr;
  float *ptr;
  int y;
  float ws;
  float v;
  Mat top_blob_c;
  int q;
  int outh;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *top_blob;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  int iVar13;
  Mat *in_stack_fffffffffffffbd0;
  int _c;
  int _h;
  Mat *in_stack_fffffffffffffbd8;
  int _w;
  Mat *in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  float local_3fc;
  int local_354;
  int *in_stack_fffffffffffffd48;
  float *in_stack_fffffffffffffd50;
  int *in_stack_fffffffffffffd58;
  float *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int iVar14;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  Mat local_248;
  Mat *local_200;
  Mat local_1f8;
  Mat *local_1b0;
  int local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float *local_188;
  int local_180;
  int local_17c;
  float *local_178;
  float *local_170;
  float *local_168;
  int local_15c;
  float *local_158;
  void *local_150;
  void *local_148;
  float local_140;
  float local_13c;
  float *local_138;
  int local_130;
  int local_12c;
  float *local_128;
  float *local_120;
  float *local_118;
  int local_10c;
  float *local_108;
  void *local_100;
  void *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  float *local_e0;
  int *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar15;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Mat *in_stack_ffffffffffffff50;
  int local_64;
  int local_4;
  
  this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  this_01 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  iVar13 = this_00->w;
  iVar14 = this_00->h;
  iVar15 = this_00->c;
  iVar1 = pvVar8->w;
  iVar2 = pvVar8->h;
  _c = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  _h = (int)in_stack_fffffffffffffbd8;
  _w = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  if (this_00->dims == 1) {
    ncnn::Mat::create(in_stack_fffffffffffffbe0,_w,_h,_c,(size_t)in_stack_fffffffffffffbc8,
                      (Allocator *)in_stack_fffffffffffffbc0);
    bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbc0);
    if (bVar7) {
      local_4 = -100;
    }
    else {
      for (local_64 = 0; local_64 < iVar13; local_64 = local_64 + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
        ncnn::Mat::operator[](this_00,(long)local_64);
        ncnn::Mat::fill(in_stack_fffffffffffffbd0,(float)((ulong)in_stack_fffffffffffffbc8 >> 0x20))
        ;
        ncnn::Mat::~Mat((Mat *)0x6af145);
      }
      local_4 = 0;
    }
  }
  else if (this_00->dims == 2) {
    if (iVar1 == iVar13) {
      ncnn::Mat::operator=(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      local_4 = 0;
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffbe0,_w,_h,(size_t)in_stack_fffffffffffffbd0,
                        (Allocator *)in_stack_fffffffffffffbc8);
      bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbc0);
      if (bVar7) {
        local_4 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 1) {
          if (iVar1 == 0) {
            local_3fc = 1.0 / *(float *)(in_RDI + 0xd4);
          }
          else {
            local_3fc = (float)iVar13 / (float)iVar1;
          }
          for (iVar15 = 0; iVar15 < iVar14; iVar15 = iVar15 + 1) {
            pfVar9 = ncnn::Mat::row(this_00,iVar15);
            local_e0 = ncnn::Mat::row(this_01,iVar15);
            for (local_e4 = 0; local_e4 < iVar1; local_e4 = local_e4 + 1) {
              local_ec = (int)((float)local_e4 * local_3fc);
              local_f0 = iVar13 + -1;
              piVar10 = std::min<int>(&local_ec,&local_f0);
              local_e8 = *piVar10;
              *local_e0 = pfVar9[local_e8];
              local_e0 = local_e0 + 1;
            }
          }
        }
        iVar13 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        if (*(int *)(in_RDI + 0xd0) == 2) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)(iVar1 * 3);
          uVar11 = SUB168(auVar3 * ZEXT816(4),0);
          if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
            uVar11 = 0xffffffffffffffff;
          }
          local_100 = operator_new__(uVar11);
          local_108 = (float *)((long)local_100 + (long)iVar1 * 4);
          local_f8 = local_100;
          linear_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                        (int)in_stack_fffffffffffffbe0,(int *)in_stack_fffffffffffffbd8,
                        (float *)in_stack_fffffffffffffbd0,
                        (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
          for (local_10c = 0; iVar13 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
              local_10c < iVar14; local_10c = local_10c + 1) {
            local_118 = ncnn::Mat::row(this_00,local_10c);
            local_120 = ncnn::Mat::row(this_01,local_10c);
            local_128 = local_108;
            for (local_12c = 0; local_12c < iVar1; local_12c = local_12c + 1) {
              local_130 = *(int *)((long)local_100 + (long)local_12c * 4);
              local_138 = local_118 + local_130;
              local_13c = *local_128;
              local_140 = local_128[1];
              *local_120 = *local_138 * local_13c + local_138[1] * local_140;
              local_128 = local_128 + 2;
              local_120 = local_120 + 1;
            }
          }
          if (local_f8 != (void *)0x0) {
            operator_delete__(local_f8);
          }
        }
        if (*(int *)(in_RDI + 0xd0) == 3) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (long)(iVar1 * 5);
          uVar11 = SUB168(auVar4 * ZEXT816(4),0);
          if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
            uVar11 = 0xffffffffffffffff;
          }
          local_150 = operator_new__(uVar11);
          local_158 = (float *)((long)local_150 + (long)iVar1 * 4);
          local_148 = local_150;
          cubic_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                       (int)in_stack_fffffffffffffbe0,(int *)in_stack_fffffffffffffbd8,
                       (float *)in_stack_fffffffffffffbd0,iVar13);
          for (local_15c = 0; local_15c < iVar14; local_15c = local_15c + 1) {
            local_168 = ncnn::Mat::row(this_00,local_15c);
            local_170 = ncnn::Mat::row(this_01,local_15c);
            local_178 = local_158;
            for (local_17c = 0; local_17c < iVar1; local_17c = local_17c + 1) {
              local_180 = *(int *)((long)local_150 + (long)local_17c * 4);
              local_188 = local_168 + local_180;
              local_18c = *local_178;
              local_190 = local_178[1];
              local_194 = local_178[2];
              local_198 = local_178[3];
              *local_170 = local_188[-1] * local_18c + *local_188 * local_190 +
                           local_188[1] * local_194 + local_188[2] * local_198;
              local_178 = local_178 + 4;
              local_170 = local_170 + 1;
            }
          }
          if (local_148 != (void *)0x0) {
            operator_delete__(local_148);
          }
        }
        local_4 = 0;
      }
    }
  }
  else if ((iVar1 == iVar13) && (iVar2 == iVar14)) {
    ncnn::Mat::operator=(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    local_4 = 0;
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffffbe0,_w,_h,_c,(size_t)in_stack_fffffffffffffbc8,
                      (Allocator *)in_stack_fffffffffffffbc0);
    bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbc0);
    if (bVar7) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd0) == 1) {
        if (iVar2 == 0) {
          in_stack_fffffffffffffbec = 1.0 / *(float *)(in_RDI + 0xd8);
        }
        else {
          in_stack_fffffffffffffbec = (float)iVar14 / (float)iVar2;
        }
        if (iVar1 == 0) {
          in_stack_fffffffffffffbe8 = 1.0 / *(float *)(in_RDI + 0xd4);
        }
        else {
          in_stack_fffffffffffffbe8 = (float)iVar13 / (float)iVar1;
        }
        local_1a0 = in_stack_fffffffffffffbe8;
        local_19c = in_stack_fffffffffffffbec;
        for (local_1a4 = 0; local_1a4 < iVar15; local_1a4 = local_1a4 + 1) {
          in_stack_fffffffffffffbd8 = &local_1f8;
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          in_stack_fffffffffffffbe0 =
               (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffffbd8);
          ncnn::Mat::~Mat((Mat *)0x6afa59);
          in_stack_fffffffffffffbc8 = &local_248;
          local_1b0 = in_stack_fffffffffffffbe0;
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          in_stack_fffffffffffffbd0 =
               (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffffbc8);
          ncnn::Mat::~Mat((Mat *)0x6afaa5);
          local_200 = in_stack_fffffffffffffbd0;
          for (local_24c = 0; local_24c < iVar2; local_24c = local_24c + 1) {
            local_254 = (int)((float)local_24c * local_19c);
            local_258 = iVar14 + -1;
            piVar10 = std::min<int>(&local_254,&local_258);
            local_250 = *piVar10;
            for (local_25c = 0; local_25c < iVar1; local_25c = local_25c + 1) {
              local_264 = (int)((float)local_25c * local_1a0);
              local_268 = iVar13 + -1;
              piVar10 = std::min<int>(&local_264,&local_268);
              local_260 = *piVar10;
              *(float *)&local_200->data =
                   *(float *)((long)&local_1b0->data + (long)(local_250 * iVar13 + local_260) * 4);
              local_200 = (Mat *)((long)&local_200->data + 4);
            }
          }
        }
      }
      iVar13 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      if (*(int *)(in_RDI + 0xd0) == 2) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (long)(iVar1 * 3 + iVar2 + iVar2 * 2);
        uVar11 = SUB168(auVar5 * ZEXT816(4),0);
        if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
          uVar11 = 0xffffffffffffffff;
        }
        pvVar12 = operator_new__(uVar11);
        src_00 = (Mat *)((long)pvVar12 + (long)(iVar1 << 1) * 4 + (long)iVar2 * 4 + (long)iVar1 * 4)
        ;
        linear_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0
                      ,(int *)in_stack_fffffffffffffbd8,(float *)in_stack_fffffffffffffbd0,
                      (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
        linear_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0
                      ,(int *)in_stack_fffffffffffffbd8,(float *)in_stack_fffffffffffffbd0,
                      (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
        for (iVar14 = 0; iVar13 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20), iVar14 < iVar15;
            iVar14 = iVar14 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          resize_bilinear_image
                    (src_00,(Mat *)CONCAT44(iVar14,in_stack_fffffffffffffd68),
                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd48);
          ncnn::Mat::~Mat((Mat *)0x6afe5a);
          ncnn::Mat::~Mat((Mat *)0x6afe67);
        }
        if (pvVar12 != (void *)0x0) {
          operator_delete__(pvVar12);
        }
      }
      if (*(int *)(in_RDI + 0xd0) == 3) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (long)(iVar1 * 5 + iVar2 + iVar2 * 4);
        uVar11 = SUB168(auVar6 * ZEXT816(4),0);
        if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
          uVar11 = 0xffffffffffffffff;
        }
        pvVar12 = operator_new__(uVar11);
        cubic_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0,
                     (int *)in_stack_fffffffffffffbd8,(float *)in_stack_fffffffffffffbd0,iVar13);
        cubic_coeffs((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0,
                     (int *)in_stack_fffffffffffffbd8,(float *)in_stack_fffffffffffffbd0,iVar13);
        for (local_354 = 0; local_354 < iVar15; local_354 = local_354 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          resize_bicubic_image
                    (in_stack_ffffffffffffff50,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40,
                     (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (float *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
          ncnn::Mat::~Mat((Mat *)0x6b00dc);
          ncnn::Mat::~Mat((Mat *)0x6b00e9);
        }
        if (pvVar12 != (void *)0x0) {
          operator_delete__(pvVar12);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = outw ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = outh ? h / (float)outh : 1.f / height_scale;
        const float ws = outw ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}